

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O0

float Jf_CutFlow(Jf_Man_t *p,int *pCut)

{
  int iVar1;
  float fVar2;
  int local_20;
  float local_1c;
  int i;
  float Flow;
  int *pCut_local;
  Jf_Man_t *p_local;
  
  local_1c = 0.0;
  local_20 = 1;
  while( true ) {
    iVar1 = Jf_CutSize(pCut);
    if (iVar1 < local_20) break;
    iVar1 = Jf_CutVar(pCut,local_20);
    fVar2 = Jf_ObjFlow(p,iVar1);
    local_1c = fVar2 + local_1c;
    local_20 = local_20 + 1;
  }
  if (0.0 <= local_1c) {
    return local_1c;
  }
  __assert_fail("Flow >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaJf.c"
                ,0x21b,"float Jf_CutFlow(Jf_Man_t *, int *)");
}

Assistant:

static inline float Jf_CutFlow( Jf_Man_t * p, int * pCut )
{
    float Flow = 0; int i; 
    for ( i = 1; i <= Jf_CutSize(pCut); i++ )
        Flow += Jf_ObjFlow( p, Jf_CutVar(pCut, i) );
    assert( Flow >= 0 );
    return Flow; 
}